

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_iterator.cpp
# Opt level: O2

void __thiscall
QFSFileEngineIterator::QFSFileEngineIterator
          (QFSFileEngineIterator *this,QString *path,IteratorFlags filters,QStringList *filterNames)

{
  QFileSystemIterator *this_00;
  long in_FS_OFFSET;
  QFileSystemEntry QStack_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractFileEngineIterator::QAbstractFileEngineIterator
            (&this->super_QAbstractFileEngineIterator,path,filters,filterNames);
  (this->super_QAbstractFileEngineIterator)._vptr_QAbstractFileEngineIterator =
       (_func_int **)&PTR__QFSFileEngineIterator_0017d698;
  this_00 = (QFileSystemIterator *)operator_new(0x68);
  QFileSystemEntry::QFileSystemEntry(&QStack_68,path);
  QFileSystemIterator::QFileSystemIterator(this_00,&QStack_68,filters);
  (this->nativeIterator)._M_t.
  super___uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>._M_t.
  super__Tuple_impl<0UL,_QFileSystemIterator_*,_std::default_delete<QFileSystemIterator>_>.
  super__Head_base<0UL,_QFileSystemIterator_*,_false>._M_head_impl = this_00;
  QFileSystemEntry::~QFileSystemEntry(&QStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFSFileEngineIterator::QFSFileEngineIterator(const QString &path, QDirListing::IteratorFlags filters,
                                             const QStringList &filterNames)
    : QAbstractFileEngineIterator(path, filters, filterNames),
      nativeIterator(new QFileSystemIterator(QFileSystemEntry(path), filters))
{
}